

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseOffsetOfExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  OffsetOfExpressionSyntax *pOVar3;
  IndexType IVar4;
  ostream *poVar5;
  allocator<char> local_39;
  string local_38;
  
  pSVar2 = peek(this,1);
  if ((pSVar2->syntaxK_ == Keyword_ExtGNU___builtin_offsetof) ||
     (pSVar2 = peek(this,1), pSVar2->syntaxK_ == Keyword_MacroStd_offsetof)) {
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this_01);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"GNU internal builtins",&local_39);
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    pOVar3 = makeNode<psy::C::OffsetOfExpressionSyntax>(this);
    *expr = &pOVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pOVar3->kwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pOVar3->openParenTkIdx_);
    if ((((bVar1) && (bVar1 = parseTypeName(this,&pOVar3->typeName_), bVar1)) &&
        (bVar1 = match(this,CommaToken,&pOVar3->commaTkIdx_), bVar1)) &&
       (bVar1 = parseOffsetOfDesignator(this,&pOVar3->offsetOfDesignator_), bVar1)) {
      bVar1 = match(this,CloseParenToken,&pOVar3->closeParenTkIdx_);
      return bVar1;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x2f3);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"assert failure: `__builtin_offsetof\'");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return false;
}

Assistant:

bool Parser::parseOffsetOfExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___builtin_offsetof
                  || peek().kind() == SyntaxKind::Keyword_MacroStd_offsetof,
                  return false,
                  "assert failure: `__builtin_offsetof'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_InternalBuiltins())
        diagReporter_.ExpectedFeature("GNU internal builtins");

    auto offsetOfExpr = makeNode<OffsetOfExpressionSyntax>();
    expr = offsetOfExpr;
    offsetOfExpr->kwTkIdx_ = consume();
    return match(SyntaxKind::OpenParenToken, &offsetOfExpr->openParenTkIdx_)
        && parseTypeName(offsetOfExpr->typeName_)
        && match(SyntaxKind::CommaToken, &offsetOfExpr->commaTkIdx_)
        && parseOffsetOfDesignator(offsetOfExpr->offsetOfDesignator_)
        && match(SyntaxKind::CloseParenToken, &offsetOfExpr->closeParenTkIdx_);
}